

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall
FastPForLib::FastPForImpl<8U,_unsigned_int>::__decodeArray
          (FastPForImpl<8U,_unsigned_int> *this,uint32_t *in,size_t *length,uint *out,size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  pointer pvVar6;
  uint32_t *source;
  int iVar7;
  uint *puVar8;
  uint32_t *puVar9;
  uint32_t run;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  uint *apuStack_930 [247];
  uint32_t *local_178;
  const_iterator unpackpointers [33];
  
  puVar9 = in + (ulong)*in + 1;
  local_178 = (uint32_t *)
              ((long)in + ((ulong)puVar9[-1] + 3 & 0xfffffffffffffffc) + 8 + (ulong)*in * 4);
  uVar13 = local_178[-1];
  iVar7 = 2;
  lVar12 = 0x30;
  for (lVar14 = -0x1f; lVar11 = 1, lVar14 != 0; lVar14 = lVar14 + 1) {
    if ((uVar13 & (uint)(1L << ((ulong)(iVar7 - 1) & 0x3f))) != 0) {
      uVar4 = *local_178;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data + lVar12),(ulong)(uVar4 + 0x1f & 0xffffffe0));
      pvVar6 = (this->datatobepacked).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar8 = *(uint **)((long)&(pvVar6->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + lVar12);
      local_178 = packingvector<32U>::unpackmetight<unsigned_int>
                            (local_178,puVar8,
                             *(long *)((long)&(pvVar6->
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              )._M_impl.super__Vector_impl_data + lVar12 + 8) -
                             (long)puVar8 >> 2,(int)lVar14 + 0x21);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&(((this->datatobepacked).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data + lVar12),(ulong)uVar4);
    }
    iVar7 = iVar7 + 1;
    lVar12 = lVar12 + 0x18;
  }
  *length = (long)local_178 - (long)in >> 2;
  unpackpointers[0x18]._M_current = (uint *)0x0;
  unpackpointers[0x19]._M_current = (uint *)0x0;
  unpackpointers[0x1a]._M_current = (uint *)0x0;
  unpackpointers[0x1b]._M_current = (uint *)0x0;
  unpackpointers[0x1c]._M_current = (uint *)0x0;
  unpackpointers[0x1d]._M_current = (uint *)0x0;
  unpackpointers[0x1e]._M_current = (uint *)0x0;
  unpackpointers[0x1f]._M_current = (uint *)0x0;
  unpackpointers[0x10]._M_current = (uint *)0x0;
  unpackpointers[0x11]._M_current = (uint *)0x0;
  unpackpointers[0x12]._M_current = (uint *)0x0;
  unpackpointers[0x13]._M_current = (uint *)0x0;
  unpackpointers[0x14]._M_current = (uint *)0x0;
  unpackpointers[0x15]._M_current = (uint *)0x0;
  unpackpointers[0x16]._M_current = (uint *)0x0;
  unpackpointers[0x17]._M_current = (uint *)0x0;
  unpackpointers[8]._M_current = (uint *)0x0;
  unpackpointers[9]._M_current = (uint *)0x0;
  unpackpointers[10]._M_current = (uint *)0x0;
  unpackpointers[0xb]._M_current = (uint *)0x0;
  unpackpointers[0xc]._M_current = (uint *)0x0;
  unpackpointers[0xd]._M_current = (uint *)0x0;
  unpackpointers[0xe]._M_current = (uint *)0x0;
  unpackpointers[0xf]._M_current = (uint *)0x0;
  unpackpointers[0]._M_current = (uint *)0x0;
  unpackpointers[1]._M_current = (uint *)0x0;
  unpackpointers[2]._M_current = (uint *)0x0;
  unpackpointers[3]._M_current = (uint *)0x0;
  unpackpointers[4]._M_current = (uint *)0x0;
  unpackpointers[5]._M_current = (uint *)0x0;
  unpackpointers[6]._M_current = (uint *)0x0;
  unpackpointers[7]._M_current = (uint *)0x0;
  unpackpointers[0x20]._M_current = (uint *)0x0;
  pvVar6 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (; pvVar6 = pvVar6 + 1, lVar11 != 0x21; lVar11 = lVar11 + 1) {
    unpackpointers[lVar11]._M_current =
         (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
         super__Vector_impl_data._M_start;
  }
  source = in + 1;
  for (uVar10 = 0; uVar10 < nvalue >> 8; uVar10 = (ulong)((int)uVar10 + 1)) {
    bVar2 = (byte)*puVar9;
    bVar3 = *(byte *)((long)puVar9 + 1);
    uVar13 = (uint)bVar3;
    source = unpackblock<256u,unsigned_int>(source,out,(uint)bVar2);
    if (bVar3 == 0) {
      puVar9 = (uint32_t *)((long)puVar9 + 2);
    }
    else {
      pbVar1 = (byte *)((long)puVar9 + 2);
      puVar9 = (uint32_t *)((long)puVar9 + 3);
      lVar14 = (ulong)*pbVar1 - (ulong)bVar2;
      if ((int)lVar14 == 1) {
        while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
          uVar5 = *puVar9;
          puVar9 = (uint32_t *)((long)puVar9 + 1);
          out[(byte)uVar5] = out[(byte)uVar5] | (uint)(1L << ((ulong)bVar2 & 0x3f));
        }
      }
      else {
        puVar8 = unpackpointers[lVar14]._M_current;
        while( true ) {
          bVar15 = uVar13 == 0;
          uVar13 = uVar13 - 1;
          if (bVar15) break;
          uVar5 = *puVar9;
          unpackpointers[lVar14]._M_current = puVar8 + 1;
          puVar9 = (uint32_t *)((long)puVar9 + 1);
          out[(byte)uVar5] = out[(byte)uVar5] | *puVar8 << ((ulong)bVar2 & 0x3f);
          puVar8 = puVar8 + 1;
        }
      }
    }
    out = out + 0x100;
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, IntType *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    IntType bitmap = *(reinterpret_cast<const IntType *>(inexcept));
    inexcept += (sizeof(IntType) + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    for (uint32_t k = 2; k <= sizeof(IntType) * 8; ++k) {
      if ((bitmap & (1ULL << (k - 1))) != 0) {
        uint32_t tnvalue = *inexcept;
        datatobepacked[k].resize((tnvalue + PACKSIZE - 1) / PACKSIZE * PACKSIZE);
        inexcept = packingvector<32>::unpackmetight(
            inexcept, datatobepacked[k].data(), datatobepacked[k].size(), k);
        datatobepacked[k].resize(tnvalue);
      }
    }
    length = inexcept - initin;
    typename std::vector<IntType>::const_iterator
        unpackpointers[sizeof(IntType) * 8 + 1];
    for (uint32_t k = 1; k <= sizeof(IntType) * 8; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblock<BlockSize>(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint64_t>(1) << b;
          }
        } else {
          typename std::vector<IntType>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (static_cast<uint64_t>(*(exceptionsptr++))) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }